

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

pair<llvm::StringMapIterator<llbuild::core::KeyID>,_bool> __thiscall
llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::try_emplace<llbuild::core::KeyID>
          (StringMap<llbuild::core::KeyID,_llvm::MallocAllocator> *this,StringRef Key,KeyID *Args)

{
  StringMapEntryBase *pSVar1;
  StringMapEntryBase *pSVar2;
  StringMapEntry<llbuild::core::KeyID> *pSVar3;
  KeyID *in_R8;
  StringRef Key_00;
  pair<llvm::StringMapIterator<llbuild::core::KeyID>,_bool> pVar4;
  bool local_91;
  StringMapIterator<llbuild::core::KeyID> local_90;
  StringMap<llbuild::core::KeyID,_llvm::MallocAllocator> *local_88;
  char *local_80;
  bool local_61;
  StringMapIterator<llbuild::core::KeyID> local_60;
  StringMapEntryBase **local_58;
  StringMapEntryBase **Bucket;
  char *local_48;
  uint local_3c;
  MallocAllocator *pMStack_38;
  uint BucketNo;
  KeyID *Args_local;
  StringMap<llbuild::core::KeyID,_llvm::MallocAllocator> *this_local;
  StringRef Key_local;
  undefined1 local_10;
  
  local_48 = (char *)Key.Length;
  Bucket = (StringMapEntryBase **)Key.Data;
  pMStack_38 = (MallocAllocator *)Args;
  Args_local = (KeyID *)this;
  this_local = (StringMap<llbuild::core::KeyID,_llvm::MallocAllocator> *)Bucket;
  Key_local.Data = local_48;
  local_3c = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  local_58 = (this->super_StringMapImpl).TheTable + local_3c;
  if (*local_58 != (StringMapEntryBase *)0x0) {
    pSVar1 = *local_58;
    pSVar2 = StringMapImpl::getTombstoneVal();
    if (pSVar1 != pSVar2) {
      StringMapIterator<llbuild::core::KeyID>::StringMapIterator
                (&local_60,(this->super_StringMapImpl).TheTable + local_3c,false);
      local_61 = false;
      pVar4 = std::make_pair<llvm::StringMapIterator<llbuild::core::KeyID>,bool>
                        (&local_60,&local_61);
      local_10 = pVar4.second;
      goto LAB_001aad26;
    }
  }
  pSVar1 = *local_58;
  pSVar2 = StringMapImpl::getTombstoneVal();
  if (pSVar1 == pSVar2) {
    (this->super_StringMapImpl).NumTombstones = (this->super_StringMapImpl).NumTombstones - 1;
  }
  local_88 = this_local;
  local_80 = Key_local.Data;
  Key_00.Length = &this->field_0x18;
  Key_00.Data = Key_local.Data;
  pSVar3 = StringMapEntry<llbuild::core::KeyID>::Create<llvm::MallocAllocator,llbuild::core::KeyID>
                     ((StringMapEntry<llbuild::core::KeyID> *)this_local,Key_00,pMStack_38,in_R8);
  *local_58 = &pSVar3->super_StringMapEntryBase;
  (this->super_StringMapImpl).NumItems = (this->super_StringMapImpl).NumItems + 1;
  if ((this->super_StringMapImpl).NumBuckets <
      (this->super_StringMapImpl).NumItems + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<llbuild::core::KeyID>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = llbuild::core::KeyID, AllocatorTy = llvm::MallocAllocator, ArgsTy = <llbuild::core::KeyID>]"
                 );
  }
  local_3c = StringMapImpl::RehashTable(&this->super_StringMapImpl,local_3c);
  StringMapIterator<llbuild::core::KeyID>::StringMapIterator
            (&local_90,(this->super_StringMapImpl).TheTable + local_3c,false);
  local_91 = true;
  pVar4 = std::make_pair<llvm::StringMapIterator<llbuild::core::KeyID>,bool>(&local_90,&local_91);
  local_10 = pVar4.second;
LAB_001aad26:
  Key_local.Length =
       (size_t)pVar4.first.
               super_StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
               .Ptr;
  pVar4.second = (bool)local_10;
  pVar4.first.
  super_StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
          )(StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
            )Key_local.Length;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }